

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove3<(moira::Instr)71,(moira::Mode)11,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  bool bVar2;
  u32 uVar3;
  u32 result;
  
  bVar1 = (byte)(this->queue).irc;
  readExt(this);
  bVar2 = writeOp<(moira::Mode)3,(moira::Size)1,64ul>(this,opcode >> 9 & 7,(uint)bVar1);
  if (bVar2) {
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    (this->reg).sr.n = 0x7f < bVar1;
    (this->reg).sr.z = bVar1 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove3(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }

    if (!writeOp <MODE_PI, S, AE_INC_PC> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}